

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O3

void test_1d_static<1ul>(void)

{
  int dptr [1];
  int *local_48;
  int local_40;
  int local_3c;
  int *local_38;
  
  local_48._0_1_ = 1;
  local_38._0_1_ = 1;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x1d,"void test_1d_static() [X = 1UL]",(bool *)&local_48,(bool *)&local_38);
  local_48 = (int *)((ulong)local_48._1_7_ << 8);
  local_38 = (int *)((ulong)local_38._1_7_ << 8);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x1f,"void test_1d_static() [X = 1UL]",(bool *)&local_48,(bool *)&local_38);
  local_48 = (int *)0x1;
  local_38 = (int *)CONCAT44(local_38._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x21,"void test_1d_static() [X = 1UL]",(unsigned_long *)&local_48,(int *)&local_38);
  local_48 = (int *)0x1;
  local_38 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x23,"void test_1d_static() [X = 1UL]",(unsigned_long *)&local_48,
             (unsigned_long *)&local_38);
  local_48 = (int *)0x1;
  local_38 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x24,"void test_1d_static() [X = 1UL]",(unsigned_long *)&local_48,
             (unsigned_long *)&local_38);
  local_40 = 0;
  do {
    local_48 = (int *)0x0;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x2b,"void test_1d_static() [X = 1UL]",(unsigned_long *)&local_48,&local_40);
    local_48 = &local_3c + local_40;
    local_38 = local_48;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x2d,"void test_1d_static() [X = 1UL]",&local_48,&local_38);
    local_3c = local_40;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x31,"void test_1d_static() [X = 1UL]",&local_3c + local_40,&local_40);
    local_40 = local_40 + 1;
  } while (local_40 == 0);
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    int dptr[X];

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 
    }
}